

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512vbmi_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  size_t i_1;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int j;
  long lVar7;
  undefined1 (*pauVar8) [64];
  size_t i;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 in_ZMM24 [64];
  undefined1 auVar43 [64];
  uint16_t buffer [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  for (uVar3 = len & 0xfffffe00; uVar3 < len; uVar3 = uVar3 + 1) {
    uVar1 = array[uVar3];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uint)((uVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0);
    }
  }
  auVar12 = vpbroadcastw_avx512bw(ZEXT216(1));
  auVar13 = vmovdqa64_avx512f(_DAT_00114b40);
  auVar14 = vmovdqa64_avx512f(_DAT_00114b80);
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  auVar40 = ZEXT1664((undefined1  [16])0x0);
  auVar38 = ZEXT1664((undefined1  [16])0x0);
  auVar37 = ZEXT1664((undefined1  [16])0x0);
  auVar41 = ZEXT1664((undefined1  [16])0x0);
  auVar10 = vpxord_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
  auVar43 = ZEXT1664(auVar10);
  uVar4 = 0;
  uVar5 = (ulong)(len >> 5 & 0xfffffff0);
  while (uVar4 < uVar5) {
    for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 0x40) {
      auVar15 = vmovdqa64_avx512f(auVar39);
      *(undefined1 (*) [64])(local_480 + lVar7) = auVar15;
    }
    auVar15 = vmovdqa64_avx512f(local_480);
    auVar16 = vmovdqa64_avx512f(local_440);
    auVar17 = vmovdqa64_avx512f(local_400);
    auVar18 = vmovdqa64_avx512f(local_3c0);
    auVar19 = vmovdqa64_avx512f(local_380);
    auVar20 = vmovdqa64_avx512f(local_340);
    auVar21 = vmovdqa64_avx512f(local_300);
    auVar22 = vmovdqa64_avx512f(local_2c0);
    auVar23 = vmovdqa64_avx512f(local_280);
    auVar24 = vmovdqa64_avx512f(local_240);
    auVar25 = vmovdqa64_avx512f(local_200);
    auVar26 = vmovdqa64_avx512f(local_1c0);
    auVar27 = vmovdqa64_avx512f(local_180);
    auVar28 = vmovdqa64_avx512f(local_140);
    auVar29 = vmovdqa64_avx512f(local_100);
    auVar30 = vmovdqa64_avx512f(local_c0);
    uVar9 = uVar4 + 0xffff;
    if (uVar5 - uVar4 < 0x10000) {
      uVar9 = uVar5;
    }
    pauVar8 = (undefined1 (*) [64])(array + uVar4 * 0x20 + 0x1e0);
    while (uVar4 < uVar9) {
      auVar31 = vmovdqu64_avx512f(pauVar8[-0xe]);
      auVar32 = vmovdqu64_avx512f(pauVar8[-0xf]);
      auVar33 = vmovdqu64_avx512f(pauVar8[-0xd]);
      auVar34 = vmovdqu64_avx512f(pauVar8[-0xc]);
      auVar35 = vmovdqu64_avx512f(pauVar8[-8]);
      uVar4 = uVar4 + 0x10;
      auVar36 = vmovdqa64_avx512f(auVar31);
      auVar31 = vpternlogd_avx512f(auVar31,auVar32,auVar43,0x96);
      auVar43 = vpternlogd_avx512f(auVar36,auVar32,auVar43,0xe8);
      auVar32 = vmovdqa64_avx512f(auVar34);
      auVar32 = vpternlogd_avx512f(auVar32,auVar33,auVar31,0xe8);
      auVar31 = vpternlogd_avx512f(auVar31,auVar33,auVar34,0x96);
      auVar33 = vmovdqu64_avx512f(pauVar8[-10]);
      auVar34 = vmovdqa64_avx512f(auVar32);
      auVar34 = vpternlogd_avx512f(auVar34,auVar43,auVar40,0xe8);
      auVar40 = vpternlogd_avx512f(auVar32,auVar43,auVar40,0x96);
      auVar43 = vmovdqu64_avx512f(pauVar8[-0xb]);
      auVar32 = vmovdqa64_avx512f(auVar35);
      auVar36 = vmovdqa64_avx512f(auVar33);
      auVar36 = vpternlogd_avx512f(auVar36,auVar43,auVar31,0xe8);
      auVar43 = vpternlogd_avx512f(auVar31,auVar43,auVar33,0x96);
      auVar31 = vmovdqu64_avx512f(pauVar8[-9]);
      auVar32 = vpternlogd_avx512f(auVar32,auVar31,auVar43,0xe8);
      auVar43 = vpternlogd_avx512f(auVar43,auVar31,auVar35,0x96);
      auVar31 = vmovdqu64_avx512f(pauVar8[-6]);
      auVar33 = vmovdqa64_avx512f(auVar32);
      auVar33 = vpternlogd_avx512f(auVar33,auVar36,auVar40,0xe8);
      auVar40 = vpternlogd_avx512f(auVar32,auVar36,auVar40,0x96);
      auVar32 = vmovdqa64_avx512f(auVar33);
      auVar32 = vpternlogd_avx512f(auVar32,auVar34,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar33,auVar34,auVar38,0x96);
      auVar33 = vmovdqu64_avx512f(pauVar8[-7]);
      auVar34 = vmovdqa64_avx512f(auVar31);
      auVar34 = vpternlogd_avx512f(auVar34,auVar33,auVar43,0xe8);
      auVar43 = vpternlogd_avx512f(auVar43,auVar33,auVar31,0x96);
      auVar31 = vmovdqu64_avx512f(pauVar8[-4]);
      auVar33 = vmovdqu64_avx512f(pauVar8[-5]);
      auVar35 = vmovdqa64_avx512f(auVar31);
      auVar35 = vpternlogd_avx512f(auVar35,auVar33,auVar43,0xe8);
      auVar43 = vpternlogd_avx512f(auVar43,auVar33,auVar31,0x96);
      auVar31 = vmovdqu64_avx512f(pauVar8[-3]);
      auVar33 = vmovdqu64_avx512f(pauVar8[-2]);
      auVar36 = vmovdqa64_avx512f(auVar35);
      auVar36 = vpternlogd_avx512f(auVar36,auVar34,auVar40,0xe8);
      auVar40 = vpternlogd_avx512f(auVar35,auVar34,auVar40,0x96);
      auVar34 = vmovdqu64_avx512f(*pauVar8);
      auVar35 = vmovdqa64_avx512f(auVar33);
      auVar35 = vpternlogd_avx512f(auVar35,auVar31,auVar43,0xe8);
      auVar43 = vpternlogd_avx512f(auVar43,auVar31,auVar33,0x96);
      auVar31 = vmovdqu64_avx512f(pauVar8[-1]);
      pauVar8 = pauVar8 + 0x10;
      auVar33 = vmovdqa64_avx512f(auVar34);
      auVar33 = vpternlogd_avx512f(auVar33,auVar31,auVar43,0xe8);
      auVar43 = vpternlogd_avx512f(auVar43,auVar31,auVar34,0x96);
      auVar31 = vpsrlw_avx512bw(auVar41,1);
      auVar34 = vmovdqa64_avx512f(auVar33);
      auVar34 = vpternlogd_avx512f(auVar34,auVar35,auVar40,0xe8);
      auVar40 = vpternlogd_avx512f(auVar33,auVar35,auVar40,0x96);
      auVar33 = vpandq_avx512f(auVar41,auVar12);
      auVar35 = vmovdqa64_avx512f(auVar34);
      auVar15 = vpaddw_avx512bw(auVar15,auVar33);
      auVar33 = vpternlogd_avx512f(auVar35,auVar36,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar34,auVar36,auVar38,0x96);
      auVar31 = vpandq_avx512f(auVar31,auVar12);
      auVar34 = vpsrlw_avx512bw(auVar41,2);
      auVar35 = vpsrlw_avx512bw(auVar41,3);
      auVar16 = vpaddw_avx512bw(auVar16,auVar31);
      auVar31 = vpandq_avx512f(auVar34,auVar12);
      auVar34 = vpsrlw_avx512bw(auVar41,4);
      auVar17 = vpaddw_avx512bw(auVar17,auVar31);
      auVar31 = vpandq_avx512f(auVar35,auVar12);
      auVar35 = vpsrlw_avx512bw(auVar41,5);
      auVar18 = vpaddw_avx512bw(auVar18,auVar31);
      auVar31 = vpandq_avx512f(auVar34,auVar12);
      auVar34 = vpsrlw_avx512bw(auVar41,6);
      auVar19 = vpaddw_avx512bw(auVar19,auVar31);
      auVar31 = vpandq_avx512f(auVar35,auVar12);
      auVar35 = vpsrlw_avx512bw(auVar41,7);
      auVar20 = vpaddw_avx512bw(auVar20,auVar31);
      auVar31 = vpandq_avx512f(auVar34,auVar12);
      auVar34 = vpsrlw_avx512bw(auVar41,8);
      auVar21 = vpaddw_avx512bw(auVar21,auVar31);
      auVar31 = vpandq_avx512f(auVar35,auVar12);
      auVar35 = vpsrlw_avx512bw(auVar41,9);
      auVar22 = vpaddw_avx512bw(auVar22,auVar31);
      auVar31 = vpandq_avx512f(auVar34,auVar12);
      auVar34 = vpsrlw_avx512bw(auVar41,10);
      auVar23 = vpaddw_avx512bw(auVar23,auVar31);
      auVar31 = vpandq_avx512f(auVar35,auVar12);
      auVar35 = vpsrlw_avx512bw(auVar41,0xb);
      auVar24 = vpaddw_avx512bw(auVar24,auVar31);
      auVar31 = vpandq_avx512f(auVar34,auVar12);
      auVar34 = vpsrlw_avx512bw(auVar41,0xc);
      auVar25 = vpaddw_avx512bw(auVar25,auVar31);
      auVar31 = vpandq_avx512f(auVar35,auVar12);
      auVar35 = vpsrlw_avx512bw(auVar41,0xd);
      auVar26 = vpaddw_avx512bw(auVar26,auVar31);
      auVar31 = vpandq_avx512f(auVar34,auVar12);
      auVar34 = vpsrlw_avx512bw(auVar41,0xe);
      auVar41 = vpsrlw_avx512bw(auVar41,0xf);
      auVar27 = vpaddw_avx512bw(auVar27,auVar31);
      auVar31 = vpandq_avx512f(auVar35,auVar12);
      auVar30 = vpaddw_avx512bw(auVar30,auVar41);
      auVar41 = vmovdqa64_avx512f(auVar33);
      auVar41 = vpternlogd_avx512f(auVar41,auVar32,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar37,auVar32,auVar33,0x96);
      auVar43 = vmovdqa64_avx512f(auVar43);
      auVar28 = vpaddw_avx512bw(auVar28,auVar31);
      auVar31 = vpandq_avx512f(auVar34,auVar12);
      auVar29 = vpaddw_avx512bw(auVar29,auVar31);
    }
    local_440 = vmovdqa64_avx512f(auVar16);
    local_400 = vmovdqa64_avx512f(auVar17);
    local_3c0 = vmovdqa64_avx512f(auVar18);
    local_380 = vmovdqa64_avx512f(auVar19);
    local_340 = vmovdqa64_avx512f(auVar20);
    local_300 = vmovdqa64_avx512f(auVar21);
    local_2c0 = vmovdqa64_avx512f(auVar22);
    local_280 = vmovdqa64_avx512f(auVar23);
    local_240 = vmovdqa64_avx512f(auVar24);
    local_200 = vmovdqa64_avx512f(auVar25);
    local_1c0 = vmovdqa64_avx512f(auVar26);
    local_180 = vmovdqa64_avx512f(auVar27);
    local_140 = vmovdqa64_avx512f(auVar28);
    local_100 = vmovdqa64_avx512f(auVar29);
    local_c0 = vmovdqa64_avx512f(auVar30);
    lVar7 = 0;
    local_480 = vmovdqa64_avx512f(auVar15);
    for (; lVar7 != 0x400; lVar7 = lVar7 + 0x40) {
      auVar15 = vpandq_avx512f(auVar41,auVar12);
      auVar15 = vpaddw_avx512bw(auVar15,*(undefined1 (*) [64])(local_480 + lVar7));
      auVar41 = vpsrlw_avx512bw(auVar41,1);
      auVar15 = vmovdqa64_avx512f(auVar15);
      *(undefined1 (*) [64])(local_480 + lVar7) = auVar15;
    }
    pauVar8 = &local_440;
    for (uVar9 = 0; uVar9 < 0x10; uVar9 = uVar9 + 2) {
      auVar15 = vmovdqa64_avx512f(pauVar8[-1]);
      auVar16 = vmovdqa64_avx512f(*pauVar8);
      pauVar8 = pauVar8 + 2;
      auVar17 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpermt2b_avx512_vbmi(auVar15,auVar14,auVar16);
      auVar16 = vpermt2b_avx512_vbmi(auVar17,auVar13,auVar16);
      auVar15 = vpsadbw_avx512bw(auVar15,auVar39);
      auVar16 = vpsadbw_avx512bw(auVar16,auVar39);
      auVar15 = vpsllq_avx512f(auVar15,8);
      auVar15 = vpaddq_avx512f(auVar15,auVar16);
      auVar15 = vpslld_avx512f(auVar15,4);
      auVar10 = vextracti32x4_avx512f(auVar15,2);
      auVar11 = vextracti64x4_avx512f(auVar15,1);
      auVar42 = vpunpcklqdq_avx(auVar15._0_16_,auVar10);
      auVar10 = vpunpckhqdq_avx(auVar15._0_16_,auVar11._0_16_);
      auVar10 = vpaddq_avx(auVar42,auVar10);
      auVar2 = vpunpcklqdq_avx2(auVar15._0_32_,auVar11);
      auVar11 = vpunpckhqdq_avx2(auVar15._0_32_,auVar11);
      auVar10 = vpaddq_avx(auVar10,auVar2._16_16_);
      auVar10 = vpaddq_avx(auVar10,auVar11._16_16_);
      auVar10 = vpshufd_avx(auVar10,0xe8);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(flags + uVar9);
      auVar10 = vpaddd_avx(auVar42,auVar10);
      *(long *)(flags + uVar9) = auVar10._0_8_;
    }
  }
  lVar7 = 0;
  local_480 = vmovdqu64_avx512f(auVar43);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_480 + lVar7 * 2);
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      flags[lVar6] = flags[lVar6] + (uint)((uVar1 >> ((uint)lVar6 & 0x1f) & 1) != 0);
    }
  }
  lVar7 = 0;
  local_480 = vmovdqu64_avx512f(auVar40);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_480 + lVar7 * 2);
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      flags[lVar6] = flags[lVar6] + ((uint)(uVar1 >> ((uint)lVar6 & 0x1f)) * 2 & 2);
    }
  }
  lVar7 = 0;
  local_480 = vmovdqu64_avx512f(auVar38);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_480 + lVar7 * 2);
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      flags[lVar6] = flags[lVar6] + (uVar1 >> ((uint)lVar6 & 0x1f) & 1) * 4;
    }
  }
  lVar7 = 0;
  local_480 = vmovdqu64_avx512f(auVar37);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_480 + lVar7 * 2);
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      flags[lVar6] = flags[lVar6] + (uVar1 >> ((uint)lVar6 & 0x1f) & 1) * 8;
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512vbmi_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (32 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m512i* data = (const __m512i*)array;
    __m512i v1  = _mm512_setzero_si512();
    __m512i v2  = _mm512_setzero_si512();
    __m512i v4  = _mm512_setzero_si512();
    __m512i v8  = _mm512_setzero_si512();
    __m512i v16 = _mm512_setzero_si512();
    __m512i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const size_t size = len / 32;
    const uint64_t limit = size - size % 16;

    uint16_t buffer[32];

    uint64_t i = 0;
    while (i < limit) {
        __m512i counter[16];
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm512_setzero_si512();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm512_add_epi16(counter[pos], _mm512_and_si512(v16, _mm512_set1_epi16(1))); \
    v16 = _mm512_srli_epi16(v16, 1); \
}
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 0), _mm512_loadu_si512(data + i + 1));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 2), _mm512_loadu_si512(data + i + 3));
            pospopcnt_csa_avx512(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 4), _mm512_loadu_si512(data + i + 5));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 6), _mm512_loadu_si512(data + i + 7));
            pospopcnt_csa_avx512(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 8),  _mm512_loadu_si512(data + i + 9));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 10), _mm512_loadu_si512(data + i + 11));
            pospopcnt_csa_avx512(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 12), _mm512_loadu_si512(data + i + 13));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 14), _mm512_loadu_si512(data + i + 15));
            pospopcnt_csa_avx512(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsB,&v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_avx512(&v16,    &v8, eightsA, eightsB);
        }

        // Update the counters after the last iteration
        for (size_t i = 0; i < 16; ++i) U(i)
#undef U
        
        for (size_t i = 0; i < 16; i += 2) {
// 00000110 00000100 00000010 00000000, 00001110 00001100 00001010 00001000, 00010110 00010100 00010010 00010000, 00011110 00011100 00011010 00011000
// {6, 4, 2, 0},                        {14, 12, 10, 8},                     {22, 20, 18, 16},                    {30, 28, 26, 24}
// 00100110 00100100 00100010 00100000, 00101110 00101100 00101010 00101000, 00110110 00110100 00110010 00110000, 00111110 00111100 00111010 00111000
// {38, 36, 34, 32},                    {46, 44, 42, 40},                    {54, 52, 50, 48},                    {62, 60, 58, 56}
// 01000110 01000100 01000010 01000000, 01001110 01001100 01001010 01001000, 01010110 01010100 01010010 01010000, 01011110 01011100 01011010 01011000
// {70, 68, 66, 64},                    {78, 76, 74, 72},                    {86, 84, 82, 80},                    {94, 92, 90, 88}
// 01100110 01100100 01100010 01100000, 01101110 01101100 01101010 01101000, 01110110 01110100 01110010 01110000, 01111110 01111100 01111010 01111000
// {102, 100, 98, 96},                  {110, 108, 106, 104},                {118, 116, 114, 112},                {126, 124, 122, 120}
            __m512i shuffle_lo = _mm512_setr_epi32(0x06040200, 0x0e0c0a08, 0x16141210, 0x1e1c1a18,
                                                   0x26242220, 0x2e2c2a28, 0x36343230, 0x3e3c3a38,
                                                   0x46444240, 0x4e4c4a48, 0x56545250, 0x5e5c5a58,
                                                   0x66646260, 0x6e6c6a68, 0x76747270, 0x7e7c7a78);

// 00000111 00000101 00000011 00000001, 00001111 00001101 00001011 00001001, 00010111 00010101 00010011 00010001, 00011111 00011101 00011011 00011001
// {7, 5, 3, 1},                        {15, 13, 11, 9},                     {23, 21, 19, 17},                    {31, 29, 27, 25}
// 00100111 00100101 00100011 00100001, 00101111 00101101 00101011 00101001, 00110111 00110101 00110011 00110001, 00111111 00111101 00111011 00111001
// {39, 37, 35, 33},                    {47, 45, 43, 41},                    {55, 53, 51, 49},                    {63, 61, 59, 57}
// 01000111 01000101 01000011 01000001, 01001111 01001101 01001011 01001001, 01010111 01010101 01010011 01010001, 01011111 01011101 01011011 01011001
// {71, 69, 67, 65},                    {79, 77, 75, 73},                    {87, 85, 83, 81},                    {95, 93, 91, 89}
// 01100111 01100101 01100011 01100001, 01101111 01101101 01101011 01101001, 01110111 01110101 01110011 01110001, 01111111 01111101 01111011 01111001
 // {103, 101, 99, 97},                 {111, 109, 107, 105},                {119, 117, 115, 113},                {127, 125, 123, 121}
            __m512i shuffle_hi = _mm512_setr_epi32(0x07050301, 0x0f0d0b09, 0x17151311, 0x1f1d1b19,
                                                   0x27252321, 0x2f2d2b29, 0x37353331, 0x3f3d3b39,
                                                   0x47454341, 0x4f4d4b49, 0x57555351, 0x5f5d5b59,
                                                   0x67656361, 0x6f6d6b69, 0x77757371, 0x7f7d7b79);
            
            // Move **lower** bytes from 16-bit counters, so bytes 0..31 of
            // results are from counter[i] and 32..63 from counter[i+1].
            __m512i lo_bytes = _mm512_permutex2var_epi8(counter[i], shuffle_lo, counter[i + 1]);

            // Likewise, move **higher** bytes.
            __m512i hi_bytes = _mm512_permutex2var_epi8(counter[i], shuffle_hi, counter[i + 1]);

            // Sum the lower bytes: now each 64-bit word holds sum of 8 bytes.
            __m512i sum_lo = _mm512_sad_epu8(lo_bytes, _mm512_setzero_si512());

            // Likewise sum the higher bytes.
            __m512i sum_hi = _mm512_sad_epu8(hi_bytes, _mm512_setzero_si512());

            // Calculate final sums --- the sum of higher bytes has to be multiplied by 256 (1 << 8)
            __m512i sum = _mm512_add_epi64(sum_lo, _mm512_slli_epi64(sum_hi, 8));

            // Since _mm512_extract* are slow. Instead we use a local buffer that is most likely cached.
            uint64_t buf64[8];
            _mm512_storeu_si512((__m512i*)buf64, _mm512_slli_epi32(sum, 4));

            flags[i + 0] += buf64[0] + buf64[1] + buf64[2] + buf64[3];
            flags[i + 1] += buf64[4] + buf64[5] + buf64[6] + buf64[7];
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v1);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 1 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v2);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    
    _mm512_storeu_si512((__m512i*)buffer, v4);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v8);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}